

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_namespace::postprocess(method_namespace *this,context_t *context,domain_type *domain)

{
  element_type *peVar1;
  var *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  undefined1 local_59;
  var local_58;
  namespace_t local_50;
  string local_40;
  
  peVar1 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"__PRAGMA_CS_NAMESPACE_DEFINITION__","");
  this_00 = domain_type::get_var(domain,&local_40);
  name = cs_impl::any::const_val<std::__cxx11::string>(this_00);
  local_50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cs::name_space,std::allocator<cs::name_space>,cs::domain_type_const&>
            (&local_50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (name_space **)&local_50,(allocator<cs::name_space> *)&local_59,domain);
  make_namespace((cs *)&local_58,&local_50);
  domain_manager::add_var_no_return<std::__cxx11::string_const&>
            (&(peVar1->super_runtime_type).storage,name,&local_58);
  cs_impl::any::recycle(&local_58);
  if (local_50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void method_namespace::postprocess(const context_t &context, const domain_type &domain)
	{
		context->instance->storage.add_var_no_return(domain.get_var("__PRAGMA_CS_NAMESPACE_DEFINITION__").const_val<string>(),
		        make_namespace(make_shared_namespace<name_space>(domain)));
	}